

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O3

Client * __thiscall
kj::Function<capnproto_test::capnp::test::TestMembrane::Thing::Client_()>::
Impl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/membrane-test.c++:306:17)>
::operator()(Client *__return_storage_ptr__,
            Impl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_membrane_test_c__:306:17)>
            *this)

{
  CapTableBuilder *pCVar1;
  WirePointer *pWVar2;
  undefined8 uVar3;
  Disposer *pDVar4;
  long *plVar5;
  size_t in_RCX;
  void *__buf;
  int in_R8D;
  bool bVar6;
  Own<capnp::ClientHook> OVar7;
  Request<capnproto_test::capnp::test::TestMembrane::MakeThingParams,_capnproto_test::capnp::test::TestMembrane::MakeThingResults>
  local_110;
  Promise<capnp::Response<capnproto_test::capnp::test::TestMembrane::MakeThingResults>_> local_d8;
  undefined8 local_c0;
  short local_b4;
  undefined4 local_b0;
  undefined8 *local_a8;
  long *local_a0;
  undefined1 local_98 [56];
  undefined8 *local_60;
  long *local_58;
  Maybe<capnp::MessageSize> local_50;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  undefined8 local_28;
  undefined4 local_20;
  
  local_50.ptr.isSet = false;
  capnproto_test::capnp::test::TestMembrane::Client::makeThingRequest
            ((Request<capnproto_test::capnp::test::TestMembrane::MakeThingParams,_capnproto_test::capnp::test::TestMembrane::MakeThingResults>
              *)(local_98 + 0x10),&((this->f).env)->membraned,&local_50);
  capnp::
  Request<capnproto_test::capnp::test::TestMembrane::MakeThingParams,_capnproto_test::capnp::test::TestMembrane::MakeThingResults>
  ::send(&local_110,
         (int)(Request<capnproto_test::capnp::test::TestMembrane::MakeThingParams,_capnproto_test::capnp::test::TestMembrane::MakeThingResults>
               *)(local_98 + 0x10),__buf,in_RCX,in_R8D);
  Promise<capnp::Response<capnproto_test::capnp::test::TestMembrane::MakeThingResults>_>::wait
            (&local_d8,&local_110);
  bVar6 = local_b4 != 0;
  local_28 = 0;
  if (bVar6) {
    local_28 = local_c0;
  }
  local_20 = 0x7fffffff;
  if (bVar6) {
    local_20 = local_b0;
  }
  local_38 = 0;
  uStack_34 = 0;
  uStack_30 = 0;
  uStack_2c = 0;
  if (bVar6) {
    local_38 = local_d8.super_PromiseBase.node.disposer._0_4_;
    uStack_34 = local_d8.super_PromiseBase.node.disposer._4_4_;
    uStack_30 = local_d8.super_PromiseBase.node.ptr._0_4_;
    uStack_2c = local_d8.super_PromiseBase.node.ptr._4_4_;
  }
  OVar7 = capnp::_::PointerReader::getCapability((PointerReader *)local_98);
  plVar5 = local_a0;
  *(undefined4 *)&__return_storage_ptr__->field_0x8 = local_98._0_4_;
  *(undefined4 *)&__return_storage_ptr__->field_0xc = local_98._4_4_;
  *(undefined4 *)&__return_storage_ptr__->field_0x10 = local_98._8_4_;
  *(undefined4 *)&__return_storage_ptr__->field_0x14 = local_98._12_4_;
  __return_storage_ptr__->_vptr_Client =
       (_func_int **)&capnproto_test::capnp::test::TestMembrane::Thing::Client::typeinfo;
  if (local_a0 != (long *)0x0) {
    local_a0 = (long *)0x0;
    (**(code **)*local_a8)(local_a8,(long)plVar5 + *(long *)(*plVar5 + -0x10),OVar7.ptr);
  }
  pDVar4 = local_110.hook.disposer;
  uVar3 = local_110.super_Builder._builder._32_8_;
  if (local_110.super_Builder._builder._32_8_ != 0) {
    local_110.super_Builder._builder.dataSize = 0;
    local_110.super_Builder._builder.pointerCount = 0;
    local_110.super_Builder._builder._38_2_ = 0;
    local_110.hook.disposer = (Disposer *)0x0;
    (**(local_110.hook.ptr)->_vptr_RequestHook)(local_110.hook.ptr,uVar3,8,pDVar4,pDVar4,0);
  }
  pWVar2 = local_110.super_Builder._builder.pointers;
  if (local_110.super_Builder._builder.pointers != (WirePointer *)0x0) {
    local_110.super_Builder._builder.pointers = (WirePointer *)0x0;
    (*(code *)**local_110.super_Builder._builder.data)
              (local_110.super_Builder._builder.data,
               (long)&(pWVar2->offsetAndKind).value + *(long *)((long)*pWVar2 + -0x10));
  }
  pCVar1 = local_110.super_Builder._builder.capTable;
  if (local_110.super_Builder._builder.capTable != (CapTableBuilder *)0x0) {
    local_110.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
    (*(code *)(((local_110.super_Builder._builder.segment)->super_SegmentReader).arena)->_vptr_Arena
    )(local_110.super_Builder._builder.segment,
      (pCVar1->super_CapTableReader)._vptr_CapTableReader[-2] +
      (long)&(pCVar1->super_CapTableReader)._vptr_CapTableReader);
  }
  plVar5 = local_58;
  if (local_58 != (long *)0x0) {
    local_58 = (long *)0x0;
    (**(code **)*local_60)(local_60,*(long *)(*plVar5 + -0x10) + (long)plVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

Return operator()(Params... params) override {
      return f(kj::fwd<Params>(params)...);
    }